

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void pnga_set_memory_limit(Integer mem_limit)

{
  if (GA_memory_limited != '\x01') {
    GA_memory_limit = mem_limit;
    GA_total_memory = mem_limit;
    if (-1 < mem_limit) {
      GA_memory_limited = '\x01';
    }
    return;
  }
  if (-1 < mem_limit) {
    GA_total_memory = GA_total_memory + (mem_limit - GA_memory_limit);
    return;
  }
  GA_memory_limited = 0;
  GA_total_memory = -1;
  return;
}

Assistant:

void pnga_set_memory_limit(Integer mem_limit)
{
  if(GA_memory_limited){

    /* if we had the limit set we need to adjust the amount available */
    if (mem_limit>=0)
      /* adjust the current value by diff between old and new limit */
      GA_total_memory += (mem_limit - GA_memory_limit);     
    else{

      /* negative values reset limit to "unlimited" */
      GA_memory_limited =  0;     
      GA_total_memory= -1;     
    }

  }else{

    GA_total_memory = GA_memory_limit  = mem_limit;
    if(mem_limit >= 0) GA_memory_limited = 1;
  }
}